

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O3

Vec_Int_t *
Bmc_PerformISearch(Gia_Man_t *p,int nFramesMax,int nTimeOut,int fReverse,int fBackTopo,int fDump,
                  int fVerbose)

{
  char *pcVar1;
  char *pcVar2;
  
  if (fVerbose != 0) {
    pcVar1 = "reverse";
    if (fReverse == 0) {
      pcVar1 = "direct";
    }
    pcVar2 = "backward";
    if (fBackTopo == 0) {
      pcVar2 = "natural";
    }
    printf("Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops with %s %s flop order:\n"
           ,p->pName,(ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs),
           (ulong)(uint)p->nRegs,pcVar1,pcVar2);
  }
  fflush(_stdout);
}

Assistant:

Vec_Int_t * Bmc_PerformISearch( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fReverse, int fBackTopo, int fDump, int fVerbose )
{
    Vec_Int_t * vLits, * vFlops;
    int i, f;
    if ( fVerbose )
    printf( "Solving M-inductiveness for design %s with %d AND nodes and %d flip-flops with %s %s flop order:\n",
        Gia_ManName(p), Gia_ManAndNum(p), Gia_ManRegNum(p), fReverse ? "reverse":"direct", fBackTopo ? "backward":"natural" );
    fflush( stdout );

    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );

    for ( f = 1; f <= nFramesMax; f++ )
        if ( Bmc_PerformISearchOne( p, f, nTimeOut, fReverse, fBackTopo, fVerbose, vLits ) )
        {
            Vec_IntFree( vLits );
            return NULL;
        }

    // dump the numbers of the flops
    if ( fDump )
    {
        int nLitsUsed = 0;
        for ( i = 0; i < Gia_ManRegNum(p); i++ )
            if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
                nLitsUsed++;
        printf( "The set contains %d (out of %d) next-state functions with 0-based numbers:\n", nLitsUsed, Gia_ManRegNum(p) );
        for ( i = 0; i < Gia_ManRegNum(p); i++ )
            if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
                printf( "%d ", i );
        printf( "\n" );
    }       
    // save flop indexes
    vFlops = Vec_IntAlloc( Gia_ManRegNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            Vec_IntPush( vFlops, 1 );
        else
            Vec_IntPush( vFlops, 0 );
    Vec_IntFree( vLits );
    return vFlops;
}